

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O2

void __thiscall
bsplib::Rdma::hpget(Rdma *this,int src_pid,Memslot src_slot,size_t src_offset,void *dst,size_t size)

{
  pointer ppvVar1;
  pointer ppvVar2;
  ssize_t sVar3;
  int __flags;
  void *dst_local;
  TicToc t;
  Action action;
  void *pvVar4;
  
  pvVar4 = dst;
  dst_local = dst;
  TicToc::TicToc(&t,HPGET,0);
  __flags = (int)pvVar4;
  if (size < this->m_min_n_hp_msg_size) {
    get(this,src_pid,src_slot,src_offset,dst,size);
  }
  else {
    if (((this->m_used_slots).
         super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>._M_impl
         .super__Vector_impl_data._M_start[(long)this->m_nprocs * src_slot + (long)this->m_pid].
         status & 1) != 0) {
      __assert_fail("!( slot( m_pid, src_slot ).status & Memblock::PUSHED)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/rdma.cc"
                    ,0x8f,"void bsplib::Rdma::hpget(int, Memslot, size_t, void *, size_t)");
    }
    ppvVar1 = (this->m_local_slots).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppvVar2 = (this->m_local_slots).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    std::vector<void_*,_std::allocator<void_*>_>::push_back(&this->m_local_slots,&dst_local);
    sVar3 = Unbuf::recv(&this->m_unbuf,src_pid,dst_local,size,__flags);
    action.dst_slot = (long)ppvVar1 - (long)ppvVar2 >> 3;
    action.kind = HPGET;
    action.dst_pid = this->m_pid;
    action.tag = (int)sVar3;
    action.target_pid = src_pid;
    action.src_pid = src_pid;
    action.src_slot = src_slot;
    action.offset = src_offset;
    action.size = size;
    ActionBuf::push_back(&this->m_send_actions,&action);
  }
  TicToc::~TicToc(&t);
  return;
}

Assistant:

void Rdma::hpget( int src_pid, Memslot src_slot, size_t src_offset,
        void * dst, size_t size )
{
#ifdef PROFILE
    TicToc t( TicToc::HPGET );
#endif
    if ( size < m_min_n_hp_msg_size ) { 
        get( src_pid, src_slot, src_offset, dst, size );
        return;
    }

    assert( !( slot( m_pid, src_slot ).status & Memblock::PUSHED) );
    
    Memslot dst_slot = m_local_slots.size();
    m_local_slots.push_back( dst );

    int tag = m_unbuf.recv( src_pid, dst, size );
    Action action = { Action::HPGET, src_pid, src_pid, m_pid, 
                      tag, src_slot, dst_slot, src_offset, size };
    m_send_actions.push_back( action );

}